

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O0

uint __thiscall
ON_ComponentManifestImpl::DeletedItemCountImpl(ON_ComponentManifestImpl *this,Type component_type)

{
  bool bVar1;
  uint uVar2;
  uint local_5c;
  Type local_49;
  undefined1 local_48 [7];
  Type t;
  ON_ModelComponentTypeIterator type_it;
  ON_ComponentManifestTableIndex *table_index;
  uint count;
  Type component_type_local;
  ON_ComponentManifestImpl *this_local;
  
  table_index._0_4_ = 0;
  bVar1 = ON_ModelComponent::ComponentTypeIsValidAndNotMixed(component_type);
  if (bVar1) {
    type_it.m_types._24_8_ = TableIndexFromTypeConst(this,component_type);
    if ((ON_ComponentManifestTableIndex *)type_it.m_types._24_8_ ==
        (ON_ComponentManifestTableIndex *)0x0) {
      local_5c = 0;
    }
    else {
      local_5c = ON_ComponentManifestTableIndex::DeletedItemCount
                           ((ON_ComponentManifestTableIndex *)type_it.m_types._24_8_);
    }
    table_index._0_4_ = local_5c;
  }
  else {
    memcpy(local_48,&ON_ModelComponentTypeIterator::ExplicitComponentTypes,0x28);
    local_49 = ON_ModelComponentTypeIterator::FirstType((ON_ModelComponentTypeIterator *)local_48);
    while (local_49 != Unset) {
      bVar1 = ON_ModelComponent::ComponentTypeIsValidAndNotMixed(local_49);
      if (bVar1) {
        uVar2 = DeletedItemCountImpl(this,local_49);
        table_index._0_4_ = uVar2 + (uint)table_index;
      }
      local_49 = ON_ModelComponentTypeIterator::NextType((ON_ModelComponentTypeIterator *)local_48);
    }
  }
  return (uint)table_index;
}

Assistant:

unsigned int ON_ComponentManifestImpl::DeletedItemCountImpl(
  ON_ModelComponent::Type component_type
  ) const
{
  unsigned int count = 0;
  if (ON_ModelComponent::ComponentTypeIsValidAndNotMixed(component_type))
  {
    const ON_ComponentManifestTableIndex* table_index = TableIndexFromTypeConst(component_type);
    count
      = (nullptr == table_index) 
      ? 0
      : table_index->DeletedItemCount();
  }
  else
  {
    ON_ModelComponentTypeIterator type_it = ON_ModelComponentTypeIterator::ExplicitComponentTypes;
    for (ON_ModelComponent::Type t = type_it.FirstType(); ON_ModelComponent::Type::Unset != t; t = type_it.NextType())
    {
      if (ON_ModelComponent::ComponentTypeIsValidAndNotMixed(t))
       count += DeletedItemCountImpl(t);
    }
  }
  return count;
}